

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall Sintatico::identificador(Sintatico *this)

{
  bool bVar1;
  undefined8 extraout_RAX;
  string local_38;
  
  bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
  if (bVar1) {
    do {
      do {
        if ((this->tok & 0xfffffffeU) == 2) {
          eat(this,this->tok);
        }
        bVar1 = Tokens::isEqual((Tokens *)this,this->tok,2);
      } while (bVar1);
      bVar1 = Tokens::isEqual((Tokens *)this,this->tok,3);
    } while (bVar1);
    return;
  }
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ID valid","");
  error(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Sintatico::identificador() {
  if (Lexico::isEqual(tok, LETRA)) {
    do {
      switch (tok) {
        case DIGITO: eat(DIGITO); break;
        case LETRA : eat(LETRA) ; break;
      }
    } while (Lexico::isEqual(tok, LETRA) || Lexico::isEqual(tok, DIGITO));
  }
  else {
    error("ID valid");
    exit(0);
  }
}